

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O0

void __thiscall
directed_graph_t::directed_graph_t
          (directed_graph_t *this,vertex_index_t _number_of_vertices,bool directed,
          float density_hint)

{
  byte in_DL;
  ushort in_SI;
  ushort *in_RDI;
  size_t vertex_number;
  value_type_conflict3 *__x;
  ushort *__new_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  
  *in_RDI = in_SI;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1aa0a4);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x1aa0b7);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1aa0ca);
  __x = (value_type_conflict3 *)(in_RDI + 0x28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1aa0dd);
  *(byte *)(in_RDI + 0x34) = in_DL & 1;
  __new_size = in_RDI + 0x38;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1aa0fc);
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x44);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1aa112);
  *(ulong *)(in_RDI + 0x50) = (ulong)((in_SI >> 6) + 1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (this_00,(size_type)__new_size,__x);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (this_00,(size_type)__new_size,__x);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (this_00,(size_type)__new_size,__x);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (this_00,(size_type)__new_size,__x);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_00,
             (size_type)__new_size);
  return;
}

Assistant:

directed_graph_t(vertex_index_t _number_of_vertices, bool directed = true, float density_hint = 0.01)
	    : number_of_vertices(_number_of_vertices), directed(directed),
	      incidence_row_length((_number_of_vertices >> 6) + 1) {
		outdegrees.resize(_number_of_vertices, 0);
		indegrees.resize(_number_of_vertices, 0);
		incidence_incoming.resize(incidence_row_length * _number_of_vertices, 0);
		incidence_outgoing.resize(incidence_row_length * _number_of_vertices, 0);

		size_t vertex_number = (size_t)_number_of_vertices;
		edges.reserve(size_t(vertex_number * density_hint * vertex_number * 2));
	}